

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_binary_expr.hpp
# Opt level: O3

ostream * viennamath::operator<<
                    (ostream *stream,
                    ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>
                    *other)

{
  ostream *poVar1;
  ct_constant<1L> local_34;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_minus<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_minus<double>,_viennamath::ct_variable<1UL>_>
  local_33;
  char *local_30;
  undefined8 local_28;
  undefined2 local_20;
  undefined6 uStack_1e;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"[",1);
  poVar1 = operator<<(stream,&local_33);
  local_20 = 0x2a;
  local_28 = 1;
  local_30 = (char *)&local_20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_20,1);
  poVar1 = operator<<(poVar1,&local_34);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  if (local_30 != (char *)&local_20) {
    operator_delete(local_30,CONCAT62(uStack_1e,local_20) + 1);
  }
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, ct_binary_expr<LHS, OP, RHS> const & other)
  {
    stream << "[" << other.lhs() << OP().str() << other.rhs() << "]";
    return stream;
  }